

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickcdef.c
# Opt level: O0

void get_cdef_filter_strengths
               (CDEF_PICK_METHOD pick_method,int *pri_strength,int *sec_strength,int strength_idx)

{
  int iVar1;
  int local_2c;
  int sec_idx;
  int pri_idx;
  int tot_sec_filter;
  int strength_idx_local;
  int *sec_strength_local;
  int *pri_strength_local;
  CDEF_PICK_METHOD pick_method_local;
  
  if (pick_method == CDEF_FAST_SEARCH_LVL5) {
    local_2c = 1;
  }
  else {
    local_2c = 4;
    if (CDEF_FAST_SEARCH_LVL2 < pick_method) {
      local_2c = 2;
    }
  }
  iVar1 = strength_idx / local_2c;
  local_2c = strength_idx % local_2c;
  *pri_strength = iVar1;
  *sec_strength = local_2c;
  if (pick_method != CDEF_FULL_SEARCH) {
    switch(pick_method) {
    case CDEF_FAST_SEARCH_LVL1:
      *pri_strength = priconv_lvl1[iVar1];
      break;
    case CDEF_FAST_SEARCH_LVL2:
      *pri_strength = priconv_lvl2[iVar1];
      break;
    case CDEF_FAST_SEARCH_LVL3:
      *pri_strength = priconv_lvl2[iVar1];
      *sec_strength = secconv_lvl3[local_2c];
      break;
    case CDEF_FAST_SEARCH_LVL4:
      *pri_strength = priconv_lvl4[iVar1];
      *sec_strength = secconv_lvl3[local_2c];
      break;
    case CDEF_FAST_SEARCH_LVL5:
      *pri_strength = priconv_lvl5[iVar1];
      *sec_strength = secconv_lvl5[local_2c];
    }
  }
  return;
}

Assistant:

static inline void get_cdef_filter_strengths(CDEF_PICK_METHOD pick_method,
                                             int *pri_strength,
                                             int *sec_strength,
                                             int strength_idx) {
  const int tot_sec_filter =
      (pick_method == CDEF_FAST_SEARCH_LVL5)
          ? REDUCED_SEC_STRENGTHS_LVL5
          : ((pick_method >= CDEF_FAST_SEARCH_LVL3) ? REDUCED_SEC_STRENGTHS_LVL3
                                                    : CDEF_SEC_STRENGTHS);
  const int pri_idx = strength_idx / tot_sec_filter;
  const int sec_idx = strength_idx % tot_sec_filter;
  *pri_strength = pri_idx;
  *sec_strength = sec_idx;
  if (pick_method == CDEF_FULL_SEARCH) return;

  switch (pick_method) {
    case CDEF_FAST_SEARCH_LVL1:
      assert(pri_idx < REDUCED_PRI_STRENGTHS_LVL1);
      *pri_strength = priconv_lvl1[pri_idx];
      break;
    case CDEF_FAST_SEARCH_LVL2:
      assert(pri_idx < REDUCED_PRI_STRENGTHS_LVL2);
      *pri_strength = priconv_lvl2[pri_idx];
      break;
    case CDEF_FAST_SEARCH_LVL3:
      assert(pri_idx < REDUCED_PRI_STRENGTHS_LVL2);
      assert(sec_idx < REDUCED_SEC_STRENGTHS_LVL3);
      *pri_strength = priconv_lvl2[pri_idx];
      *sec_strength = secconv_lvl3[sec_idx];
      break;
    case CDEF_FAST_SEARCH_LVL4:
      assert(pri_idx < REDUCED_PRI_STRENGTHS_LVL4);
      assert(sec_idx < REDUCED_SEC_STRENGTHS_LVL3);
      *pri_strength = priconv_lvl4[pri_idx];
      *sec_strength = secconv_lvl3[sec_idx];
      break;
    case CDEF_FAST_SEARCH_LVL5:
      assert(pri_idx < REDUCED_PRI_STRENGTHS_LVL4);
      assert(sec_idx < REDUCED_SEC_STRENGTHS_LVL5);
      *pri_strength = priconv_lvl5[pri_idx];
      *sec_strength = secconv_lvl5[sec_idx];
      break;
    default: assert(0 && "Invalid CDEF search method");
  }
}